

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  Curl_dns_entry *pCVar1;
  int iVar2;
  CURLcode CVar3;
  
  iVar2 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if (iVar2 == 0) {
    CVar3 = CURLE_OK;
  }
  else {
    CVar3 = getaddrinfo_complete(conn);
  }
  (conn->async).done = true;
  pCVar1 = (conn->async).dns;
  if (entry != (Curl_dns_entry **)0x0) {
    *entry = pCVar1;
  }
  if (pCVar1 == (Curl_dns_entry *)0x0) {
    CVar3 = resolver_error(conn);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd))
    result = getaddrinfo_complete(conn);
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}